

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void __thiscall Search::predictor::set_input_at(predictor *this,size_t posn,example *ex)

{
  ostream *poVar1;
  vw_exception *pvVar2;
  stringstream __msg;
  string sStack_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198;
  
  if (this->ec_alloced == false) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_198,"call to set_input_at without previous call to set_input_length",0x3e);
    pvVar2 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
               ,0xc7b,&local_1c8);
    __cxa_throw(pvVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (posn < this->ec_cnt) {
    VW::copy_example_data
              (false,this->ec + posn,ex,_DAT_002d6d48,
               (_func_void_void_ptr_void_ptr *)PTR_copy_label_002d6d38);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_198,"call to set_input_at with too large a position: posn (",0x36);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") >= ec_cnt(",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  pvVar2 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
             ,0xc7e,&sStack_1e8);
  __cxa_throw(pvVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void predictor::set_input_at(size_t posn, example& ex)
{
  if (!ec_alloced)
    THROW("call to set_input_at without previous call to set_input_length");

  if (posn >= ec_cnt)
    THROW("call to set_input_at with too large a position: posn (" << posn << ") >= ec_cnt(" << ec_cnt << ")");

  VW::copy_example_data(
      false, ec + posn, &ex, CS::cs_label.label_size, CS::cs_label.copy_label);  // TODO: the false is "audit"
}